

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O1

sxi64 HashmapCount(jx9_hashmap *pMap,int bRecursive,int iRecCount)

{
  uint uVar1;
  uint uVar2;
  jx9_vm *pjVar3;
  jx9_hashmap_node *pjVar4;
  undefined8 *puVar5;
  sxi64 sVar6;
  uint uVar7;
  jx9_hashmap_node **ppjVar8;
  long lVar9;
  ulong uVar10;
  
  uVar7 = pMap->nEntry;
  uVar10 = (ulong)uVar7;
  if (bRecursive != 0) {
    if (uVar7 == 0) {
      lVar9 = 0;
    }
    else {
      pjVar3 = pMap->pVm;
      ppjVar8 = &pMap->pLast;
      uVar1 = (pjVar3->aMemObj).nUsed;
      lVar9 = 0;
      do {
        pjVar4 = *ppjVar8;
        uVar2 = pjVar4->nValIdx;
        if (uVar2 < uVar1) {
          puVar5 = (undefined8 *)
                   ((ulong)(uVar2 * (pjVar3->aMemObj).eSize) + (long)(pjVar3->aMemObj).pBase);
        }
        else {
          puVar5 = (undefined8 *)0x0;
        }
        if ((puVar5 != (undefined8 *)0x0) && ((*(byte *)(puVar5 + 1) & 0x40) != 0)) {
          if (0x1f < iRecCount) {
            return lVar9;
          }
          sVar6 = HashmapCount((jx9_hashmap *)*puVar5,1,iRecCount + 1);
          lVar9 = lVar9 + sVar6;
        }
        ppjVar8 = &pjVar4->pNext;
        uVar7 = uVar7 - 1;
      } while (uVar7 != 0);
    }
    uVar10 = lVar9 + uVar10;
  }
  return uVar10;
}

Assistant:

static sxi64 HashmapCount(jx9_hashmap *pMap, int bRecursive, int iRecCount)
{
	sxi64 iCount = 0;
	if( !bRecursive ){
		iCount = pMap->nEntry;
	}else{
		/* Recursive hashmap walk */
		jx9_hashmap_node *pEntry = pMap->pLast;
		jx9_value *pElem;
		sxu32 n = 0;
		for(;;){
			if( n >= pMap->nEntry ){
				break;
			}
			/* Point to the element value */
			pElem = (jx9_value *)SySetAt(&pMap->pVm->aMemObj, pEntry->nValIdx);
			if( pElem ){
				if( pElem->iFlags & MEMOBJ_HASHMAP ){
					if( iRecCount > 31 ){
						/* Nesting limit reached */
						return iCount;
					}
					/* Recurse */
					iRecCount++;
					iCount += HashmapCount((jx9_hashmap *)pElem->x.pOther, TRUE, iRecCount);
					iRecCount--;
				}
			}
			/* Point to the next entry */
			pEntry = pEntry->pNext;
			++n;
		}
		/* Update count */
		iCount += pMap->nEntry;
	}
	return iCount;
}